

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

int Gia_ObjCheckMffc_rec(Gia_Man_t *p,Gia_Obj_t *pObj,int Limit,Vec_Int_t *vNodes)

{
  int *piVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  
  uVar2 = (uint)*(undefined8 *)pObj;
  if ((~uVar2 & 0x9fffffff) == 0) {
    return 1;
  }
  if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaResub.c"
                  ,0x35,"int Gia_ObjCheckMffc_rec(Gia_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)");
  }
  pGVar3 = p->pObjs;
  if ((pGVar3 <= pObj) && (pObj < pGVar3 + p->nObjs)) {
    iVar4 = (int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555 - (uVar2 & 0x1fffffff);
    Vec_IntPush(vNodes,iVar4);
    piVar1 = p->pRefs + iVar4;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      if (Limit < vNodes->nSize) {
        return 0;
      }
      iVar4 = Gia_ObjCheckMffc_rec
                        (p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff),Limit,vNodes);
      if (iVar4 == 0) {
        return 0;
      }
    }
    pGVar3 = p->pObjs;
    if ((pGVar3 <= pObj) && (pObj < pGVar3 + p->nObjs)) {
      iVar4 = (int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555 -
              (*(uint *)&pObj->field_0x4 & 0x1fffffff);
      Vec_IntPush(vNodes,iVar4);
      piVar1 = p->pRefs + iVar4;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        if (Limit < vNodes->nSize) {
          return 0;
        }
        iVar4 = Gia_ObjCheckMffc_rec
                          (p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),Limit,vNodes);
        if (iVar4 == 0) {
          return 0;
        }
      }
      pGVar3 = p->pObjs;
      if ((pGVar3 <= pObj) && (pObj < pGVar3 + p->nObjs)) {
        if (p->pMuxes == (uint *)0x0) {
          return 1;
        }
        uVar2 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555];
        if (uVar2 == 0) {
          return 1;
        }
        if ((int)uVar2 < 0) {
LAB_0074abf2:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf2,"int Abc_Lit2Var(int)");
        }
        Vec_IntPush(vNodes,uVar2 >> 1);
        piVar1 = p->pRefs + (uVar2 >> 1);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 != 0) {
          return 1;
        }
        if (Limit < vNodes->nSize) {
          return 0;
        }
        if (p->pMuxes == (uint *)0x0) {
          pGVar3 = (Gia_Obj_t *)0x0;
        }
        else {
          pGVar3 = p->pObjs;
          if ((pObj < pGVar3) || (pGVar3 + p->nObjs <= pObj)) goto LAB_0074abb4;
          uVar2 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555];
          if ((int)uVar2 < 0) goto LAB_0074abf2;
          uVar2 = uVar2 >> 1;
          if (p->nObjs <= (int)uVar2) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar3 = pGVar3 + uVar2;
        }
        iVar4 = Gia_ObjCheckMffc_rec(p,pGVar3,Limit,vNodes);
        if (iVar4 != 0) {
          return 1;
        }
        return 0;
      }
    }
  }
LAB_0074abb4:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes MFFCs of all qualifying nodes.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Gia_ObjCheckMffc_rec( Gia_Man_t * p,Gia_Obj_t * pObj, int Limit, Vec_Int_t * vNodes )
{
    int iFanin;
    if ( Gia_ObjIsCi(pObj) )
        return 1;
    assert( Gia_ObjIsAnd(pObj) );
    iFanin = Gia_ObjFaninId0p(p, pObj);
    Vec_IntPush( vNodes, iFanin );
    if ( !Gia_ObjRefDecId(p, iFanin) && (Vec_IntSize(vNodes) > Limit || !Gia_ObjCheckMffc_rec(p, Gia_ObjFanin0(pObj), Limit, vNodes)) )
        return 0;
    iFanin = Gia_ObjFaninId1p(p, pObj);
    Vec_IntPush( vNodes, iFanin );
    if ( !Gia_ObjRefDecId(p, iFanin) && (Vec_IntSize(vNodes) > Limit || !Gia_ObjCheckMffc_rec(p, Gia_ObjFanin1(pObj), Limit, vNodes)) )
        return 0;
    if ( !Gia_ObjIsMux(p, pObj) )
        return 1;
    iFanin = Gia_ObjFaninId2p(p, pObj);
    Vec_IntPush( vNodes, iFanin );
    if ( !Gia_ObjRefDecId(p, iFanin) && (Vec_IntSize(vNodes) > Limit || !Gia_ObjCheckMffc_rec(p, Gia_ObjFanin2(p, pObj), Limit, vNodes)) )
        return 0;
    return 1;
}